

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O0

void __thiscall
async::threadpool_scheduler::threadpool_scheduler
          (threadpool_scheduler *this,size_t num_threads,function<void_()> *prerun,
          function<void_()> *postrun)

{
  threadpool_data *this_00;
  pointer ptVar1;
  thread_data_t *ptVar2;
  int local_4c;
  pointer local_48;
  thread local_40 [3];
  function<void_()> *local_28;
  function<void_()> *postrun_local;
  function<void_()> *prerun_local;
  size_t num_threads_local;
  threadpool_scheduler *this_local;
  
  local_28 = postrun;
  postrun_local = prerun;
  prerun_local = (function<void_()> *)num_threads;
  num_threads_local = (size_t)this;
  this_00 = (threadpool_data *)operator_new(0xb0);
  detail::threadpool_data::threadpool_data(this_00,(size_t)prerun_local,postrun_local,local_28);
  std::
  unique_ptr<async::detail::threadpool_data,std::default_delete<async::detail::threadpool_data>>::
  unique_ptr<std::default_delete<async::detail::threadpool_data>,void>
            ((unique_ptr<async::detail::threadpool_data,std::default_delete<async::detail::threadpool_data>>
              *)this,this_00);
  local_48 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::get(&this->impl);
  local_4c = 0;
  std::thread::
  thread<void(&)(async::detail::threadpool_data*,unsigned_long,unsigned_long),async::detail::threadpool_data*,int,unsigned_long&,void>
            (local_40,detail::recursive_spawn_worker_thread,&local_48,&local_4c,
             (unsigned_long *)&prerun_local);
  ptVar1 = std::
           unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
           ::operator->(&this->impl);
  ptVar2 = detail::aligned_array<async::detail::thread_data_t,_64UL>::operator[]
                     (&ptVar1->thread_data,0);
  std::thread::operator=(&ptVar2->handle,local_40);
  std::thread::~thread(local_40);
  return;
}

Assistant:

threadpool_scheduler::threadpool_scheduler(std::size_t num_threads,
                                           std::function<void()>&& prerun,
                                           std::function<void()>&& postrun)
    : impl(new detail::threadpool_data(num_threads, std::move(prerun), std::move(postrun)))
{
	// Start worker threads
	impl->thread_data[0].handle = std::thread(detail::recursive_spawn_worker_thread, impl.get(), 0, num_threads);
#ifdef BROKEN_JOIN_IN_DESTRUCTOR
	impl->thread_data[0].handle.detach();
#endif
}